

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O0

void __thiscall
ApprovalTests::CommandReporter::CommandReporter
          (CommandReporter *this,string *command,string *args,CommandLauncher *launcher)

{
  _func_int **in_RCX;
  string *in_RDX;
  CommandReporter *in_RSI;
  Reporter *in_RDI;
  
  Reporter::Reporter(in_RDI);
  in_RDI->_vptr_Reporter = (_func_int **)&PTR__CommandReporter_00281a00;
  ::std::__cxx11::string::string((string *)(in_RDI + 1),(string *)in_RSI);
  ::std::__cxx11::string::string((string *)(in_RDI + 5),in_RDX);
  in_RDI[9]._vptr_Reporter = in_RCX;
  ::std::shared_ptr<ApprovalTests::ConvertForCygwin>::shared_ptr
            ((shared_ptr<ApprovalTests::ConvertForCygwin> *)0x2081f7);
  checkForCygwin(in_RSI);
  return;
}

Assistant:

CommandReporter::CommandReporter(std::string command,
                                     std::string args,
                                     CommandLauncher* launcher)
        : cmd(std::move(command)), arguments(std::move(args)), l(launcher)
    {
        checkForCygwin();
    }